

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_channel_map_apply_f32
               (float *pFramesOut,ma_channel *pChannelMapOut,ma_uint32 channelsOut,float *pFramesIn,
               ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_uint64 frameCount,
               ma_channel_mix_mode mode,ma_mono_expansion_mode monoExpansionMode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ma_channel mVar6;
  byte bVar7;
  ma_channel_conversion_path mVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 *puVar15;
  ma_uint64 mVar16;
  ulong uVar17;
  float fVar18;
  float weights [32] [32];
  ulong local_1078;
  undefined1 local_1038 [4104];
  
  uVar14 = (ulong)channelsIn;
  mVar8 = ma_channel_map_get_conversion_path
                    (pChannelMapIn,channelsIn,pChannelMapOut,channelsOut,ma_channel_mix_mode_default
                    );
  uVar9 = (ulong)channelsOut;
  if (mVar8 == ma_channel_conversion_path_mono_in) {
    if (frameCount != 0 &&
        (pFramesIn != (float *)0x0 && (channelsOut != 0 && pFramesOut != (float *)0x0))) {
      mVar16 = 0;
      do {
        uVar14 = 0;
        do {
          if (pChannelMapOut == (ma_channel *)0x0) {
            mVar6 = ma_channel_map_init_standard_channel
                              (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar14);
          }
          else {
            mVar6 = pChannelMapOut[uVar14];
          }
          if (mVar6 != '\0') {
            pFramesOut[uVar14] = *pFramesIn;
          }
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
        pFramesIn = pFramesIn + 1;
        mVar16 = mVar16 + 1;
        pFramesOut = pFramesOut + uVar9;
      } while (mVar16 != frameCount);
    }
  }
  else if (mVar8 == ma_channel_conversion_path_mono_out) {
    if (channelsIn != 0 && (pFramesIn != (float *)0x0 && pFramesOut != (float *)0x0)) {
      uVar9 = 0;
      uVar13 = 0;
      do {
        if (pChannelMapIn == (ma_channel *)0x0) {
          mVar6 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar9);
        }
        else {
          mVar6 = pChannelMapIn[uVar9];
        }
        uVar13 = (uVar13 + 1) - (uint)(mVar6 == '\0');
        uVar9 = uVar9 + 1;
      } while (uVar14 != uVar9);
      if (uVar13 == 0) {
        for (uVar14 = frameCount << 2; uVar14 != 0; uVar14 = uVar14 - sVar10) {
          sVar10 = 0xffffffff;
          if (uVar14 < 0xffffffff) {
            sVar10 = uVar14;
          }
          memset(pFramesOut,0,sVar10);
          pFramesOut = (float *)((long)pFramesOut + sVar10);
        }
      }
      else if (frameCount != 0) {
        mVar16 = 0;
        do {
          fVar18 = 0.0;
          uVar9 = 0;
          do {
            if (pChannelMapIn == (ma_channel *)0x0) {
              mVar6 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar9);
            }
            else {
              mVar6 = pChannelMapIn[uVar9];
            }
            if (mVar6 != '\0') {
              fVar18 = fVar18 + pFramesIn[uVar9];
            }
            uVar9 = uVar9 + 1;
          } while (uVar14 != uVar9);
          *pFramesOut = fVar18 / (float)uVar13;
          pFramesOut = pFramesOut + 1;
          mVar16 = mVar16 + 1;
          pFramesIn = pFramesIn + uVar14;
        } while (mVar16 != frameCount);
      }
    }
  }
  else if (mVar8 == ma_channel_conversion_path_passthrough) {
    if (pFramesOut != pFramesIn) {
      for (uVar14 = (channelsOut << 2) * frameCount; uVar14 != 0; uVar14 = uVar14 - sVar10) {
        sVar10 = 0xffffffff;
        if (uVar14 < 0xffffffff) {
          sVar10 = uVar14;
        }
        memcpy(pFramesOut,pFramesIn,sVar10);
        pFramesOut = (float *)((long)pFramesOut + sVar10);
        pFramesIn = (float *)((long)pFramesIn + sVar10);
      }
    }
  }
  else if (channelsOut < 0xff) {
    if (channelsOut < 0x21 && channelsIn < 0x21) {
      if (channelsOut != 0) {
        puVar15 = local_1038;
        local_1078 = 0;
        do {
          if (pChannelMapOut == (ma_channel *)0x0) {
            bVar7 = ma_channel_map_init_standard_channel
                              (ma_standard_channel_map_default,channelsOut,(ma_uint32)local_1078);
          }
          else {
            bVar7 = pChannelMapOut[local_1078];
          }
          if (channelsIn != 0) {
            fVar18 = g_maChannelPlaneRatios[bVar7][0];
            fVar1 = g_maChannelPlaneRatios[bVar7][1];
            fVar2 = g_maChannelPlaneRatios[bVar7][2];
            fVar3 = g_maChannelPlaneRatios[bVar7][3];
            fVar4 = g_maChannelPlaneRatios[bVar7][5];
            uVar17 = 0;
            do {
              if (pChannelMapIn == (ma_channel *)0x0) {
                bVar7 = ma_channel_map_init_standard_channel
                                  (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar17);
              }
              else {
                bVar7 = pChannelMapIn[uVar17];
              }
              *(float *)(puVar15 + uVar17 * 4) =
                   g_maChannelPlaneRatios[bVar7][5] * fVar4 +
                   g_maChannelPlaneRatios[bVar7][3] * fVar3 +
                   g_maChannelPlaneRatios[bVar7][2] * fVar2 +
                   g_maChannelPlaneRatios[bVar7][0] * fVar18 +
                   g_maChannelPlaneRatios[bVar7][1] * fVar1 + 0.0;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          local_1078 = local_1078 + 1;
          puVar15 = puVar15 + 0x80;
        } while (local_1078 != uVar9);
      }
      if (frameCount != 0) {
        uVar17 = 0;
        do {
          if (channelsOut != 0) {
            uVar11 = 0;
            puVar15 = local_1038;
            do {
              fVar18 = 0.0;
              if (channelsIn != 0) {
                uVar12 = 0;
                do {
                  fVar18 = fVar18 + pFramesIn[uVar12] * *(float *)(puVar15 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
              pFramesOut[uVar11] = fVar18;
              uVar11 = uVar11 + 1;
              puVar15 = puVar15 + 0x80;
            } while (uVar11 != uVar9);
          }
          pFramesOut = pFramesOut + uVar9;
          uVar17 = (ulong)((int)uVar17 + 1);
          pFramesIn = pFramesIn + uVar14;
        } while (uVar17 < frameCount);
      }
    }
    else if (frameCount != 0) {
      uVar17 = 0;
      do {
        if (channelsOut != 0) {
          uVar11 = 0;
          do {
            if (pChannelMapOut == (ma_channel *)0x0) {
              bVar7 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar11);
            }
            else {
              bVar7 = pChannelMapOut[uVar11];
            }
            if (channelsIn == 0) {
              fVar18 = 0.0;
            }
            else {
              fVar1 = g_maChannelPlaneRatios[bVar7][0];
              fVar2 = g_maChannelPlaneRatios[bVar7][1];
              fVar3 = g_maChannelPlaneRatios[bVar7][2];
              fVar4 = g_maChannelPlaneRatios[bVar7][3];
              fVar5 = g_maChannelPlaneRatios[bVar7][5];
              fVar18 = 0.0;
              uVar12 = 0;
              do {
                if (pChannelMapIn == (ma_channel *)0x0) {
                  bVar7 = ma_channel_map_init_standard_channel
                                    (ma_standard_channel_map_default,channelsIn,(ma_uint32)uVar12);
                }
                else {
                  bVar7 = pChannelMapIn[uVar12];
                }
                fVar18 = fVar18 + (g_maChannelPlaneRatios[bVar7][5] * fVar5 +
                                  g_maChannelPlaneRatios[bVar7][3] * fVar4 +
                                  g_maChannelPlaneRatios[bVar7][2] * fVar3 +
                                  g_maChannelPlaneRatios[bVar7][0] * fVar1 +
                                  g_maChannelPlaneRatios[bVar7][1] * fVar2 + 0.0) *
                                  pFramesIn[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
            pFramesOut[uVar11] = fVar18;
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar9);
        }
        pFramesOut = pFramesOut + uVar9;
        uVar17 = (ulong)((int)uVar17 + 1);
        pFramesIn = pFramesIn + uVar14;
      } while (uVar17 < frameCount);
    }
  }
  else {
    for (uVar14 = (channelsOut << 2) * frameCount; uVar14 != 0; uVar14 = uVar14 - sVar10) {
      sVar10 = 0xffffffff;
      if (uVar14 < 0xffffffff) {
        sVar10 = uVar14;
      }
      memset(pFramesOut,0,sVar10);
      pFramesOut = (float *)((long)pFramesOut + sVar10);
    }
  }
  return;
}

Assistant:

static void ma_channel_map_apply_f32(float* pFramesOut, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, const float* pFramesIn, const ma_channel* pChannelMapIn, ma_uint32 channelsIn, ma_uint64 frameCount, ma_channel_mix_mode mode, ma_mono_expansion_mode monoExpansionMode)
{
    ma_channel_conversion_path conversionPath = ma_channel_map_get_conversion_path(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, mode);

    /* Optimized Path: Passthrough */
    if (conversionPath == ma_channel_conversion_path_passthrough) {
        ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, channelsOut);
        return;
    }

    /* Special Path: Mono Output. */
    if (conversionPath == ma_channel_conversion_path_mono_out) {
        ma_channel_map_apply_mono_out_f32(pFramesOut, pFramesIn, pChannelMapIn, channelsIn, frameCount);
        return;
    }

    /* Special Path: Mono Input. */
    if (conversionPath == ma_channel_conversion_path_mono_in) {
        ma_channel_map_apply_mono_in_f32(pFramesOut, pChannelMapOut, channelsOut, pFramesIn, frameCount, monoExpansionMode);
        return;
    }

    /* Getting here means we aren't running on an optimized conversion path. */
    if (channelsOut <= MA_MAX_CHANNELS) {
        ma_result result;

        if (mode == ma_channel_mix_mode_simple) {
            ma_channel shuffleTable[MA_MAX_CHANNELS];

            result = ma_channel_map_build_shuffle_table(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, shuffleTable);
            if (result != MA_SUCCESS) {
                return;
            }

            result = ma_channel_map_apply_shuffle_table(pFramesOut, channelsOut, pFramesIn, channelsIn, frameCount, shuffleTable, ma_format_f32);
            if (result != MA_SUCCESS) {
                return;
            }
        } else {
            ma_uint32 iFrame;
            ma_uint32 iChannelOut;
            ma_uint32 iChannelIn;
            float weights[32][32];  /* Do not use MA_MAX_CHANNELS here! */

            /*
            If we have a small enough number of channels, pre-compute the weights. Otherwise we'll just need to
            fall back to a slower path because otherwise we'll run out of stack space.
            */
            if (channelsIn <= ma_countof(weights) && channelsOut <= ma_countof(weights)) {
                /* Pre-compute weights. */
                for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                    ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);
                    for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                        ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                        weights[iChannelOut][iChannelIn] = ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                    }
                }

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            accumulation += pFramesIn[iChannelIn] * weights[iChannelOut][iChannelIn];
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            } else {
                /* Cannot pre-compute weights because not enough room in stack-allocated buffer. */
                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;
                        ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                            accumulation += pFramesIn[iChannelIn] * ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            }
        }
    } else {
        /* Fall back to silence. If you hit this, what are you doing with so many channels?! */
        ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, channelsOut);
    }
}